

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

bool __thiscall String::toBool(String *this)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  String local_38;
  
  if (this->data->len != 0) {
    local_38.data = &local_38._data;
    local_38._data.ref = 0;
    local_38._data.str = "false";
    local_38._data.len = 5;
    bVar2 = equalsIgnoreCase(this,&local_38);
    if (bVar2) {
      ~String(&local_38);
    }
    else {
      bVar2 = operator==(this,(char (*) [2])0x1185ef);
      ~String(&local_38);
      if (!bVar2) {
        pcVar3 = operator_cast_to_char_(this);
        do {
          pcVar4 = pcVar3 + 1;
          cVar1 = *pcVar3;
          pcVar3 = pcVar4;
        } while (cVar1 == '0');
        if (cVar1 == '.') {
          do {
            pcVar3 = pcVar4;
            pcVar4 = pcVar3 + 1;
          } while (*pcVar3 == '0');
          if (*pcVar3 == '\0') {
            if (pcVar3[-1] == '0') {
              return false;
            }
            if (*this->data->str == '0') {
              return false;
            }
          }
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool toBool() const
  {
    if(data->len == 0 || equalsIgnoreCase("false") || *this == "0")
      return false;
    const char* p = *this;
    for(; *p == '0'; ++p);
    if(*p == '.')
    {
      for(++p; *p == '0'; ++p);
      if(!*p && (p[-1] == '0' || *data->str == '0'))
        return false;
    }
    return true;
  }